

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O0

bool text_has_been_edited(Am_Object *inter,Am_Object *text)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_String local_28;
  Am_String new_text;
  Am_String orig_text;
  Am_Object *text_local;
  Am_Object *inter_local;
  
  Am_String::Am_String(&new_text);
  Am_String::Am_String(&local_28);
  pAVar2 = Am_Object::Get(inter,0x16c,0);
  Am_String::operator=(&new_text,pAVar2);
  pAVar2 = Am_Object::Get(text,0xab,0);
  Am_String::operator=(&local_28,pAVar2);
  bVar1 = Am_String::operator==(&new_text,&local_28);
  Am_String::~Am_String(&local_28);
  Am_String::~Am_String(&new_text);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool
text_has_been_edited(Am_Object inter, Am_Object text)
{
  Am_String orig_text, new_text;
  orig_text = inter.Get(Am_OLD_VALUE);
  new_text = text.Get(Am_TEXT);
  return !(orig_text == new_text);
}